

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
luna::Exception::
SetWhat<char_const*&,char,int&,char_const(&)[13],char_const*&,char,char_const*&,char_const(&)[3],char_const*&,char_const(&)[6],char_const*,char_const(&)[8]>
          (Exception *this,ostringstream *oss,char **arg,char *args,int *args_1,char (*args_2) [13],
          char **args_3,char *args_4,char **args_5,char (*args_6) [3],char **args_7,
          char (*args_8) [6],char **args_9,char (*args_10) [8])

{
  ostringstream *in_RCX;
  Exception *in_RDX;
  ostream *in_RSI;
  char (*in_RDI) [13];
  char *in_R8;
  int *in_R9;
  char *unaff_R14;
  char **unaff_R15;
  char (*unaff_retaddr) [3];
  char **in_stack_00000008;
  char (*in_stack_00000010) [6];
  char **in_stack_00000018;
  char (*in_stack_00000020) [8];
  char **in_stack_ffffffffffffffa0;
  
  std::operator<<(in_RSI,*(char **)in_RDX);
  SetWhat<char,int&,char_const(&)[13],char_const*&,char,char_const*&,char_const(&)[3],char_const*&,char_const(&)[6],char_const*,char_const(&)[8]>
            (in_RDX,in_RCX,in_R8,in_R9,in_RDI,in_stack_ffffffffffffffa0,unaff_R14,unaff_R15,
             unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020);
  return;
}

Assistant:

void SetWhat(std::ostringstream &oss, Arg&& arg, Args&&... args)
        {
            oss << std::forward<Arg>(arg);
            SetWhat(oss, std::forward<Args>(args)...);
        }